

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree.hpp
# Opt level: O0

void __thiscall
pico_tree::
kd_tree<std::reference_wrapper<std::vector<std::array<float,784ul>,std::allocator<std::array<float,784ul>>>const>,pico_tree::metric_l2_squared,int>
::
kd_tree<pico_tree::max_leaf_size_t,pico_tree::bounds_from_space_t,pico_tree::sliding_midpoint_max_side_t>
          (kd_tree<std::reference_wrapper<const_std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>,_pico_tree::metric_l2_squared,_int>
           *this,space_type space,
          splitter_stop_condition_t<pico_tree::max_leaf_size_t> *stop_condition,
          splitter_start_bounds_t<pico_tree::bounds_from_space_t> *start_bounds,
          splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *rule)

{
  vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_> *space_00;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *in_stack_00001918;
  splitter_start_bounds_t<pico_tree::bounds_from_space_t> *in_stack_00001920;
  splitter_stop_condition_t<pico_tree::max_leaf_size_t> *in_stack_00001928;
  build_kd_tree<pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_784UL>,_784UL>
  *in_stack_00001930;
  space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>
  in_stack_00001938;
  space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>
  local_38 [7];
  
  *in_RDI = in_RSI;
  space_00 = ::std::reference_wrapper::operator_cast_to_vector_
                       ((reference_wrapper<const_std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>
                         *)0x10829b);
  internal::
  space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>
  ::space_wrapper(local_38,space_00);
  internal::
  build_kd_tree<pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,float>,784ul>,784ul>
  ::operator()(in_stack_00001930,in_stack_00001938,in_stack_00001928,in_stack_00001920,
               in_stack_00001918);
  return;
}

Assistant:

kd_tree(
      space_type space,
      splitter_stop_condition_t<Stop_> const& stop_condition,
      splitter_start_bounds_t<Bounds_> const& start_bounds = Bounds_{},
      splitter_rule_t<Rule_> const& rule = Rule_{})
      : space_(std::move(space)),
        metric_(),
        data_(
            internal::build_kd_tree<kd_tree_data_type, dim>()(
                space_wrapper_type(space_),
                stop_condition,
                start_bounds,
                rule)) {}